

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

int coda_type_record_field_set_bit_offset_expression
              (coda_type_record_field *field,coda_expression *bit_offset_expr)

{
  coda_format cVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (field == (coda_type_record_field *)0x0) {
    pcVar3 = "field argument is NULL (%s:%u)";
    uVar2 = 0x472;
  }
  else {
    if (bit_offset_expr != (coda_expression *)0x0) {
      if (field->bit_offset_expr != (coda_expression *)0x0) {
        coda_set_error(-400,"field already has a bit offset expression");
        return -1;
      }
      cVar1 = field->type->format;
      if (1 < (ulong)cVar1) {
        if (cVar1 < (coda_format_rinex|coda_format_xml)) {
          pcVar3 = *(char **)(&DAT_001dea00 + (ulong)cVar1 * 8);
        }
        else {
          pcVar3 = "unknown";
        }
        coda_set_error(-400,"bit offset expression not allowed for record field with %s format",
                       pcVar3);
        return -1;
      }
      field->bit_offset_expr = bit_offset_expr;
      return 0;
    }
    pcVar3 = "bit_offset_expr argument is NULL (%s:%u)";
    uVar2 = 0x477;
  }
  coda_set_error(-100,pcVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar2);
  return -1;
}

Assistant:

int coda_type_record_field_set_bit_offset_expression(coda_type_record_field *field, coda_expression *bit_offset_expr)
{
    if (field == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (bit_offset_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "bit_offset_expr argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (field->bit_offset_expr != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "field already has a bit offset expression");
        return -1;
    }
    if (field->type->format != coda_format_ascii && field->type->format != coda_format_binary)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "bit offset expression not allowed for record field with %s format",
                       coda_type_get_format_name(field->type->format));
        return -1;
    }
    field->bit_offset_expr = bit_offset_expr;
    return 0;
}